

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O1

uint __thiscall
wallet::CWallet::ComputeTimeSmart(CWallet *this,CWalletTx *wtx,bool rescanning_old_block)

{
  ulong uVar1;
  Chain *pCVar2;
  _Base_ptr p_Var3;
  CWalletTx *pCVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> parameters_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> parameters_2;
  bool bVar5;
  int iVar6;
  _Base_ptr p_Var7;
  uint uVar8;
  _Rb_tree_const_iterator<std::pair<const_long,_wallet::CWalletTx_*>_> __tmp;
  ulong uVar10;
  ulong uVar11;
  long in_FS_OFFSET;
  int64_t block_max_time;
  int64_t blocktime;
  optional<uint256> block_hash;
  uint in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  ulong in_stack_ffffffffffffff00;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined1 *puVar14;
  undefined1 *puVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  string local_a8;
  string local_88;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined1 local_48;
  long local_38;
  ulong uVar9;
  
  puVar15 = &stack0xfffffffffffffef8;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = ((wtx->m_state).
              super__Variant_base<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
              .
              super__Move_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
              .
              super__Copy_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
              .
              super__Move_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
              .
              super__Copy_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
              .
              super__Variant_storage_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
              ._M_index & 0xfd) == 0;
  if ((bool)local_48) {
    local_68 = *(undefined8 *)
                &(wtx->m_state).
                 super__Variant_base<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                 .
                 super__Move_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                 .
                 super__Copy_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                 .
                 super__Move_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                 .
                 super__Copy_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                 .
                 super__Variant_storage_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                 ._M_u;
    uStack_60 = *(undefined8 *)
                 ((long)&(wtx->m_state).
                         super__Variant_base<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                         .
                         super__Move_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                         .
                         super__Copy_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                         .
                         super__Move_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                         .
                         super__Copy_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                         .
                         super__Variant_storage_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                         ._M_u + 8);
    local_58 = *(undefined8 *)
                ((long)&(wtx->m_state).
                        super__Variant_base<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                        .
                        super__Move_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                        .
                        super__Copy_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                        .
                        super__Move_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                        .
                        super__Copy_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                        .
                        super__Variant_storage_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                        ._M_u + 0x10);
    uStack_50 = *(undefined8 *)
                 ((long)&(wtx->m_state).
                         super__Variant_base<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                         .
                         super__Move_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                         .
                         super__Copy_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                         .
                         super__Move_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                         .
                         super__Copy_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                         .
                         super__Variant_storage_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                         ._M_u + 0x18);
  }
  uVar10 = (ulong)wtx->nTimeReceived;
  if ((bool)local_48) {
    pCVar2 = this->m_chain;
    if (pCVar2 == (Chain *)0x0) {
      __assert_fail("m_chain",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.h"
                    ,0x1f5,"interfaces::Chain &wallet::CWallet::chain() const");
    }
    uVar16 = 0;
    uVar17 = 0;
    uVar12 = 0;
    uVar13 = 0;
    puVar14 = &stack0xffffffffffffff00;
    iVar6 = (*pCVar2->_vptr_Chain[10])(pCVar2,&local_68);
    if ((char)iVar6 == '\0') {
      base_blob<256u>::ToString_abi_cxx11_
                (&local_88,
                 &((wtx->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->hash);
      base_blob<256u>::ToString_abi_cxx11_(&local_a8,&local_68);
      parameters_1._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffefc;
      parameters_1._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffef8;
      parameters_1._M_string_length = in_stack_ffffffffffffff00;
      parameters_1.field_2._M_allocated_capacity = uVar12;
      parameters_1.field_2._8_8_ = uVar13;
      parameters_2._M_string_length = (size_type)puVar15;
      parameters_2._M_dataplus._M_p = puVar14;
      parameters_2.field_2._M_allocated_capacity = uVar16;
      parameters_2.field_2._8_8_ = uVar17;
      WalletLogPrintf<char_const*,std::__cxx11::string,std::__cxx11::string>
                (this,"%s: found %s in block %s not in index\n","ComputeTimeSmart",parameters_1,
                 parameters_2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
    }
    else if (rescanning_old_block) {
      uVar10 = (ulong)in_stack_fffffffffffffef8;
    }
    else {
      uVar10 = (ulong)wtx->nTimeReceived;
      p_Var3 = (this->wtxOrdered)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var7 = &(this->wtxOrdered)._M_t._M_impl.super__Rb_tree_header._M_header;
      if (p_Var7 == p_Var3) {
        uVar11 = 0;
      }
      else {
        uVar1 = uVar10 + 300;
        uVar11 = 0;
        do {
          p_Var7 = (_Base_ptr)std::_Rb_tree_decrement((_Rb_tree_node_base *)p_Var7);
          pCVar4 = (CWalletTx *)p_Var7[1]._M_parent;
          if (pCVar4 == wtx) {
            bVar5 = false;
          }
          else {
            uVar8 = pCVar4->nTimeSmart;
            if (uVar8 == 0) {
              uVar8 = pCVar4->nTimeReceived;
            }
            uVar9 = (ulong)uVar8;
            bVar5 = false;
            if (uVar9 <= uVar1) {
              if (uVar10 <= uVar9) {
                uVar10 = uVar9;
              }
              bVar5 = true;
              uVar11 = uVar9;
            }
          }
        } while ((!bVar5) && (p_Var7 != p_Var3));
      }
      if ((long)uVar10 < (long)in_stack_ffffffffffffff00) {
        in_stack_ffffffffffffff00 = uVar10;
      }
      uVar10 = in_stack_ffffffffffffff00;
      if ((long)in_stack_ffffffffffffff00 < (long)uVar11) {
        uVar10 = uVar11;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (uint)uVar10;
}

Assistant:

unsigned int CWallet::ComputeTimeSmart(const CWalletTx& wtx, bool rescanning_old_block) const
{
    std::optional<uint256> block_hash;
    if (auto* conf = wtx.state<TxStateConfirmed>()) {
        block_hash = conf->confirmed_block_hash;
    } else if (auto* conf = wtx.state<TxStateBlockConflicted>()) {
        block_hash = conf->conflicting_block_hash;
    }

    unsigned int nTimeSmart = wtx.nTimeReceived;
    if (block_hash) {
        int64_t blocktime;
        int64_t block_max_time;
        if (chain().findBlock(*block_hash, FoundBlock().time(blocktime).maxTime(block_max_time))) {
            if (rescanning_old_block) {
                nTimeSmart = block_max_time;
            } else {
                int64_t latestNow = wtx.nTimeReceived;
                int64_t latestEntry = 0;

                // Tolerate times up to the last timestamp in the wallet not more than 5 minutes into the future
                int64_t latestTolerated = latestNow + 300;
                const TxItems& txOrdered = wtxOrdered;
                for (auto it = txOrdered.rbegin(); it != txOrdered.rend(); ++it) {
                    CWalletTx* const pwtx = it->second;
                    if (pwtx == &wtx) {
                        continue;
                    }
                    int64_t nSmartTime;
                    nSmartTime = pwtx->nTimeSmart;
                    if (!nSmartTime) {
                        nSmartTime = pwtx->nTimeReceived;
                    }
                    if (nSmartTime <= latestTolerated) {
                        latestEntry = nSmartTime;
                        if (nSmartTime > latestNow) {
                            latestNow = nSmartTime;
                        }
                        break;
                    }
                }

                nTimeSmart = std::max(latestEntry, std::min(blocktime, latestNow));
            }
        } else {
            WalletLogPrintf("%s: found %s in block %s not in index\n", __func__, wtx.GetHash().ToString(), block_hash->ToString());
        }
    }
    return nTimeSmart;
}